

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.hpp
# Opt level: O0

void __thiscall
gl4cts::GLSL420Pack::BindingImageArrayTest::~BindingImageArrayTest(BindingImageArrayTest *this)

{
  BindingImageArrayTest *this_local;
  
  ~BindingImageArrayTest(this);
  operator_delete(this,0x128);
  return;
}

Assistant:

virtual ~BindingImageArrayTest()
	{
	}